

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O2

ngx_int_t ngx_http_charset_body_filter(ngx_http_request_t *r,ngx_chain_t *in)

{
  size_t *psVar1;
  byte bVar2;
  ushort uVar3;
  uint32_t uVar4;
  long lVar5;
  ngx_chain_t *pnVar6;
  ulong uVar7;
  ngx_chain_t *pnVar8;
  ngx_chain_t *pnVar9;
  ngx_buf_t *pnVar10;
  ngx_int_t nVar11;
  ushort uVar12;
  ngx_chain_t **ppnVar13;
  ushort uVar14;
  ushort uVar15;
  u_char *puVar16;
  ngx_chain_t *pnVar17;
  ulong uVar18;
  ngx_buf_t *pnVar19;
  ngx_http_charset_ctx_t *pnVar20;
  size_t sVar21;
  byte *pbVar22;
  u_char *puVar23;
  byte *pbVar24;
  u_char uVar25;
  byte *pbVar26;
  u_char *puVar27;
  ngx_chain_t *local_a0;
  ngx_chain_t *out;
  u_char *local_90;
  ngx_chain_t **local_88;
  u_char *local_80;
  u_char *local_78;
  u_char *local_70;
  ngx_chain_t *local_68;
  ngx_http_request_t *local_60;
  u_char *local_58;
  u_char *src;
  ngx_pool_t *local_48;
  ngx_http_charset_ctx_t *local_40;
  ngx_buf_t *local_38;
  
  pnVar20 = (ngx_http_charset_ctx_t *)r->ctx[ngx_http_charset_filter_module.ctx_index];
  if ((pnVar20 == (ngx_http_charset_ctx_t *)0x0) || (pnVar20->table == (u_char *)0x0)) {
LAB_0015cf0a:
    nVar11 = (*ngx_http_next_body_filter)(r,in);
    return nVar11;
  }
  if (((pnVar20->field_0x46 & 3) == 0) && (pnVar8 = in, pnVar20->busy == (ngx_chain_t *)0x0)) {
LAB_0015cec2:
    if (pnVar8 != (ngx_chain_t *)0x0) {
      pnVar10 = pnVar8->buf;
      puVar16 = pnVar20->table;
      pbVar22 = pnVar10->last;
      for (pbVar24 = pnVar10->pos; pbVar24 < pbVar22; pbVar24 = pbVar24 + 1) {
        if (*pbVar24 != puVar16[*pbVar24]) goto LAB_0015cee8;
      }
      goto LAB_0015cf04;
    }
    goto LAB_0015cf0a;
  }
  ppnVar13 = &local_a0;
  local_a0 = (ngx_chain_t *)0x0;
  local_80 = &pnVar20->field_0x44;
  local_70 = pnVar20->saved;
  out = (ngx_chain_t *)0xffffffffffffffff;
  local_60 = r;
  local_40 = pnVar20;
LAB_0015c607:
  pnVar8 = local_a0;
  if (in == (ngx_chain_t *)0x0) {
    nVar11 = (*ngx_http_next_body_filter)(r,local_a0);
    pnVar9 = pnVar20->busy;
    if (pnVar8 != (ngx_chain_t *)0x0) {
      pnVar6 = pnVar9;
      if (pnVar9 == (ngx_chain_t *)0x0) {
        ppnVar13 = &pnVar20->busy;
        pnVar9 = pnVar8;
      }
      else {
        do {
          pnVar17 = pnVar6;
          pnVar6 = pnVar17->next;
        } while (pnVar6 != (ngx_chain_t *)0x0);
        ppnVar13 = &pnVar17->next;
      }
      *ppnVar13 = pnVar8;
    }
    while( true ) {
      pnVar8 = pnVar9;
      if (pnVar8 == (ngx_chain_t *)0x0) {
        return nVar11;
      }
      pnVar10 = pnVar8->buf;
      if ((pnVar10->field_0x48 & 7) == 0) {
        lVar5 = pnVar10->file_last - pnVar10->file_pos;
      }
      else {
        lVar5 = (long)pnVar10->last - (long)pnVar10->pos;
      }
      if (lVar5 != 0) break;
      pnVar9 = pnVar8->next;
      pnVar20->busy = pnVar9;
      if ((ngx_module_t *)pnVar10->tag == &ngx_http_charset_filter_module) {
        pnVar19 = pnVar10->shadow;
        if (pnVar19 != (ngx_buf_t *)0x0) {
          pnVar19->pos = pnVar19->last;
        }
        ppnVar13 = &pnVar20->free_buffers;
        if (pnVar10->pos == (u_char *)0x0) {
          ppnVar13 = &pnVar20->free_bufs;
        }
        pnVar8->next = *ppnVar13;
        *ppnVar13 = pnVar8;
      }
    }
    return nVar11;
  }
  local_38 = in->buf;
  if ((local_38->field_0x48 & 7) == 0) {
    lVar5 = local_38->file_last - local_38->file_pos;
  }
  else {
    lVar5 = (long)local_38->last - (long)local_38->pos;
  }
  if (lVar5 != 0) {
    local_48 = r->pool;
    local_88 = ppnVar13;
    local_68 = in;
    if ((*(uint *)local_80 >> 0x11 & 1) == 0) {
      puVar16 = local_38->pos;
      sVar21 = pnVar20->saved_len;
      local_58 = puVar16;
      if (sVar21 == 0) {
        lVar5 = 0;
        puVar23 = puVar16;
        for (puVar27 = puVar16; local_58 = puVar27, puVar27 < local_38->last; puVar27 = puVar27 + 1)
        {
          if ((char)*puVar27 < '\0') {
            if ((ulong)-lVar5 < 0x201) {
              puVar23 = (u_char *)((long)local_38->last + (-(long)puVar23 - lVar5));
              pnVar6 = (ngx_chain_t *)0x0;
              puVar27 = puVar16;
              local_58 = puVar16;
            }
            else {
              pnVar6 = ngx_http_charset_get_buf(local_48,pnVar20);
              if (pnVar6 == (ngx_chain_t *)0x0) goto LAB_0015ce5a;
              pnVar10 = pnVar6->buf;
              uVar14 = *(ushort *)&local_38->field_0x48 & 1;
              uVar3 = (ushort)*(undefined4 *)&pnVar10->field_0x48;
              *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xfffe | uVar14;
              uVar12 = *(ushort *)&local_38->field_0x48 & 2;
              *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xfffc | uVar14 | uVar12;
              uVar15 = *(ushort *)&local_38->field_0x48 & 4;
              *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xfff8 | uVar14 | uVar12 | uVar15;
              *(ushort *)&pnVar10->field_0x48 =
                   uVar3 & 0xffd8 | uVar14 | uVar12 | uVar15 |
                   *(ushort *)&local_38->field_0x48 & 0x20;
              pnVar10->pos = local_38->pos;
              pnVar10->last = puVar27;
              pnVar6->buf = pnVar10;
              pnVar6->next = (ngx_chain_t *)0x0;
              puVar23 = local_38->last + -(long)puVar23;
              local_78 = puVar27;
              uVar4 = ngx_utf8_decode(&local_78,(size_t)puVar23);
              pnVar20 = local_40;
              if (uVar4 == 0xfffffffe) {
                memcpy(local_70,puVar27,(size_t)puVar23);
                local_40->saved_len = (size_t)puVar23;
                pnVar10->shadow = local_38;
                pnVar20 = local_40;
                goto LAB_0015ce34;
              }
            }
            puVar16 = puVar23 + 10;
            if ((u_char *)0x9 < puVar23) {
              puVar16 = puVar23;
            }
            pnVar8 = ngx_http_charset_get_buffer(local_48,pnVar20,(size_t)puVar16);
            if (pnVar8 == (ngx_chain_t *)0x0) goto LAB_0015ce5a;
            pnVar9 = pnVar8;
            if (pnVar6 != (ngx_chain_t *)0x0) {
              pnVar6->next = pnVar8;
              pnVar9 = pnVar6;
            }
            pnVar10 = pnVar8->buf;
            puVar23 = pnVar10->pos;
            pnVar20 = local_40;
            goto LAB_0015cc79;
          }
          puVar23 = puVar23 + 1;
          lVar5 = lVar5 + -1;
        }
        goto LAB_0015c852;
      }
      puVar23 = puVar16;
      if ((local_48->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,local_48->log,0,"http charset utf saved: %z",sVar21);
        sVar21 = pnVar20->saved_len;
      }
      while ((sVar21 < 4 && (pnVar20->saved[sVar21] = *puVar23, puVar23 + 1 != local_38->last))) {
        sVar21 = sVar21 + 1;
        puVar23 = puVar23 + 1;
      }
      local_78 = local_70;
      uVar4 = ngx_utf8_decode(&local_78,sVar21);
      if (uVar4 < 0x10000) {
        if (*(long *)(pnVar20->table + (ulong)(uVar4 >> 8) * 8) == 0) goto LAB_0015c8e1;
        uVar25 = *(u_char *)
                  (*(long *)(pnVar20->table + (ulong)(uVar4 >> 8) * 8) + (ulong)(uVar4 & 0xff));
LAB_0015c8e4:
        uVar7 = (long)local_38->last - (long)local_38->pos;
        sVar21 = uVar7 + 10;
        if (9 < uVar7) {
          sVar21 = uVar7;
        }
        pnVar8 = ngx_http_charset_get_buffer(local_48,local_40,sVar21);
        pnVar20 = local_40;
        if (pnVar8 == (ngx_chain_t *)0x0) goto LAB_0015ce5a;
        pnVar10 = pnVar8->buf;
        puVar23 = pnVar10->pos;
        if (uVar25 == '\0') {
          if (uVar4 == 0xfffffffe) {
            *puVar23 = '?';
            if ((local_48->log->log_level & 0x100) != 0) {
              ngx_log_error_core(8,local_48->log,0,"http charset invalid utf 0");
            }
            puVar23 = puVar23 + 1;
            local_78 = local_80;
          }
          else if (uVar4 < 0x110000) {
            puVar23 = ngx_sprintf(puVar23,"&#%uD;",(ulong)uVar4);
            pnVar20 = local_40;
          }
          else {
            *puVar23 = '?';
            puVar23 = puVar23 + 1;
            if ((local_48->log->log_level & 0x100) != 0) {
              ngx_log_error_core(8,local_48->log,0,"http charset invalid utf 1");
            }
          }
        }
        else {
          *puVar23 = uVar25;
          puVar23 = puVar23 + 1;
        }
        puVar27 = puVar16 + ((long)local_78 - (long)(local_70 + pnVar20->saved_len));
        pnVar20->saved_len = 0;
        pnVar9 = pnVar8;
        local_58 = puVar27;
LAB_0015cc79:
        ppnVar13 = &pnVar8->next;
        local_90 = pnVar20->table;
        pnVar19 = local_38;
        while (puVar27 < pnVar19->last) {
          if ((ulong)((long)pnVar10->end - (long)puVar23) < 10) {
            pnVar10->last = puVar23;
            pnVar8 = ngx_http_charset_get_buffer
                               (local_48,pnVar20,(size_t)(pnVar19->last + (10 - (long)puVar27)));
            if (pnVar8 == (ngx_chain_t *)0x0) goto LAB_0015ce5a;
            *ppnVar13 = pnVar8;
            ppnVar13 = &pnVar8->next;
            pnVar10 = pnVar8->buf;
            puVar23 = pnVar10->pos;
            pnVar19 = local_38;
            pnVar20 = local_40;
            puVar27 = local_58;
          }
          if ((char)*puVar27 < '\0') {
            sVar21 = (long)pnVar19->last - (long)puVar27;
            src = (u_char *)pnVar10;
            uVar4 = ngx_utf8_decode(&local_58,sVar21);
            pnVar20 = local_40;
            pnVar19 = local_38;
            pnVar10 = (ngx_buf_t *)src;
            puVar27 = local_58;
            if (uVar4 < 0x10000) {
              if ((*(long *)(local_90 + (ulong)(uVar4 >> 8) * 8) == 0) ||
                 (uVar25 = *(u_char *)
                            (*(long *)(local_90 + (ulong)(uVar4 >> 8) * 8) + (ulong)(uVar4 & 0xff)),
                 uVar25 == '\0')) {
LAB_0015cd8a:
                puVar23 = ngx_sprintf(puVar23,"&#%uD;",(ulong)uVar4);
                pnVar19 = local_38;
                pnVar10 = (ngx_buf_t *)src;
                pnVar20 = local_40;
                puVar27 = local_58;
              }
              else {
                *puVar23 = uVar25;
                puVar23 = puVar23 + 1;
              }
            }
            else {
              if (uVar4 == 0xfffffffe) {
                memcpy(local_70,local_58,sVar21);
                local_40->saved_len = sVar21;
                pnVar19 = local_38;
                pnVar10 = (ngx_buf_t *)src;
                pnVar20 = local_40;
                if (*(u_char **)src == puVar23) {
                  *(ushort *)(src + 0x48) = (ushort)*(undefined4 *)(src + 0x48) & 0xffbe | 0x40;
                }
                break;
              }
              if (uVar4 < 0x110000) goto LAB_0015cd8a;
              *puVar23 = '?';
              puVar23 = puVar23 + 1;
              if ((local_48->log->log_level & 0x100) != 0) {
                ngx_log_error_core(8,local_48->log,0,"http charset invalid utf 2");
                pnVar19 = local_38;
                pnVar10 = (ngx_buf_t *)src;
                pnVar20 = local_40;
                puVar27 = local_58;
              }
            }
          }
          else {
            local_58 = puVar27 + 1;
            *puVar23 = *puVar27;
            puVar23 = puVar23 + 1;
            puVar27 = local_58;
          }
        }
        pnVar10->last = puVar23;
        uVar14 = *(ushort *)&pnVar19->field_0x48 & 0x80;
        uVar3 = (ushort)*(undefined4 *)&pnVar10->field_0x48;
        *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xff7f | uVar14;
        uVar12 = *(ushort *)&pnVar19->field_0x48 & 0x100;
        *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xfe7f | uVar14 | uVar12;
        *(ushort *)&pnVar10->field_0x48 =
             uVar3 & 0xfe5f | uVar14 | uVar12 | *(ushort *)&pnVar19->field_0x48 & 0x20;
        pnVar10->shadow = pnVar19;
        pnVar6 = pnVar9;
      }
      else {
        if (uVar4 != 0xfffffffe || 3 < sVar21) {
LAB_0015c8e1:
          uVar25 = '\0';
          goto LAB_0015c8e4;
        }
        pnVar6 = ngx_http_charset_get_buf(local_48,pnVar20);
        pnVar20 = local_40;
        if (pnVar6 == (ngx_chain_t *)0x0) goto LAB_0015ce5a;
        pnVar10 = pnVar6->buf;
        pnVar10->pos = local_38->pos;
        pnVar10->last = local_38->last;
        pnVar10->field_0x48 = pnVar10->field_0x48 | 0x40;
        pnVar10->shadow = local_38;
        memcpy(local_70 + local_40->saved_len,puVar16,sVar21);
        psVar1 = &pnVar20->saved_len;
        *psVar1 = *psVar1 + sVar21;
      }
    }
    else {
      puVar16 = pnVar20->table;
      pbVar24 = local_38->pos;
      uVar18 = (long)local_38->last - (long)pbVar24;
      uVar7 = 0;
      pbVar26 = pbVar24;
      for (pbVar22 = pbVar24; pbVar22 < local_38->last; pbVar22 = pbVar22 + 1) {
        if (puVar16[(ulong)*pbVar22 * 4] != '\x01') {
          src = puVar16;
          if (uVar7 < 0x201) {
            sVar21 = uVar7 + (uVar18 >> 1) * ((ulong)(*(uint *)local_80 & 0xffff) + 1);
            pnVar8 = (ngx_chain_t *)0x0;
          }
          else {
            pnVar8 = ngx_http_charset_get_buf(local_48,pnVar20);
            if (pnVar8 == (ngx_chain_t *)0x0) goto LAB_0015ce5a;
            pnVar10 = pnVar8->buf;
            uVar14 = *(ushort *)&local_38->field_0x48 & 1;
            uVar3 = (ushort)*(undefined4 *)&pnVar10->field_0x48;
            *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xfffe | uVar14;
            uVar12 = *(ushort *)&local_38->field_0x48 & 2;
            *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xfffc | uVar14 | uVar12;
            uVar15 = *(ushort *)&local_38->field_0x48 & 4;
            *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xfff8 | uVar14 | uVar12 | uVar15;
            *(ushort *)&pnVar10->field_0x48 =
                 uVar3 & 0xffd8 | uVar14 | uVar12 | uVar15 | *(ushort *)&local_38->field_0x48 & 0x20
            ;
            pnVar10->pos = local_38->pos;
            pnVar10->last = pbVar22;
            pnVar8->buf = pnVar10;
            pnVar8->next = (ngx_chain_t *)0x0;
            sVar21 = ((ulong)*(ushort *)local_80 + 1) *
                     ((ulong)((long)local_38->last - (long)pbVar26) >> 1);
            pnVar20 = local_40;
            pbVar24 = pbVar22;
          }
          pnVar9 = ngx_http_charset_get_buffer(local_48,pnVar20,sVar21);
          if (pnVar9 == (ngx_chain_t *)0x0) goto LAB_0015ce5a;
          pnVar6 = pnVar9;
          if (pnVar8 != (ngx_chain_t *)0x0) {
            pnVar8->next = pnVar9;
            pnVar6 = pnVar8;
          }
          ppnVar13 = &pnVar9->next;
          pnVar10 = pnVar9->buf;
          puVar23 = pnVar10->pos;
          puVar16 = src + 1;
          pnVar19 = local_38;
          puVar27 = src;
          local_90 = puVar16;
          goto LAB_0015c98d;
        }
        pbVar26 = pbVar26 + 1;
        uVar7 = uVar7 + 1;
        uVar18 = uVar18 - 1;
      }
LAB_0015c852:
      pnVar6 = ngx_alloc_chain_link(local_48);
      if (pnVar6 == (ngx_chain_t *)0x0) {
LAB_0015ce5a:
        *local_88 = (ngx_chain_t *)0x0;
        return (ngx_int_t)out;
      }
      pnVar6->buf = local_38;
      pnVar6->next = (ngx_chain_t *)0x0;
      pnVar20 = local_40;
    }
    goto LAB_0015ce34;
  }
  pnVar8 = ngx_alloc_chain_link(r->pool);
  *ppnVar13 = pnVar8;
  if (pnVar8 == (ngx_chain_t *)0x0) {
    return (ngx_int_t)out;
  }
  pnVar8->buf = local_38;
  (*ppnVar13)->next = (ngx_chain_t *)0x0;
  ppnVar13 = &(*ppnVar13)->next;
  goto LAB_0015c6f9;
LAB_0015cee8:
  do {
    bVar2 = puVar16[*pbVar24];
    if (*pbVar24 != bVar2) {
      *pbVar24 = bVar2;
    }
    pbVar24 = pbVar24 + 1;
  } while (pbVar24 < pbVar22);
  pnVar10->field_0x48 = pnVar10->field_0x48 & 0xef;
LAB_0015cf04:
  pnVar8 = pnVar8->next;
  goto LAB_0015cec2;
LAB_0015c98d:
  if (pnVar19->last <= pbVar24) goto LAB_0015ca23;
  bVar2 = *pbVar24;
  pbVar24 = pbVar24 + 1;
  uVar7 = (ulong)puVar27[(ulong)bVar2 * 4];
  if ((ulong)((long)pnVar10->end - (long)puVar23) < uVar7) {
    pnVar10->last = puVar23;
    uVar18 = (ulong)((long)pnVar19->last - (long)pbVar24) >> 1;
    pnVar8 = ngx_http_charset_get_buffer
                       (local_48,local_40,*(ushort *)&local_40->field_0x44 * uVar18 + uVar18 + uVar7
                       );
    if (pnVar8 == (ngx_chain_t *)0x0) goto LAB_0015ce5a;
    *ppnVar13 = pnVar8;
    ppnVar13 = &pnVar8->next;
    pnVar10 = pnVar8->buf;
    puVar23 = pnVar10->pos;
    pnVar19 = local_38;
    puVar27 = src;
    puVar16 = local_90;
  }
  for (uVar18 = 0; uVar7 != uVar18; uVar18 = uVar18 + 1) {
    puVar23[uVar18] = puVar16[uVar18 + (ulong)bVar2 * 4];
  }
  puVar23 = puVar23 + uVar18;
  goto LAB_0015c98d;
LAB_0015ca23:
  pnVar10->last = puVar23;
  uVar14 = *(ushort *)&pnVar19->field_0x48 & 0x80;
  uVar3 = (ushort)*(undefined4 *)&pnVar10->field_0x48;
  *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xff7f | uVar14;
  uVar12 = *(ushort *)&pnVar19->field_0x48 & 0x100;
  *(ushort *)&pnVar10->field_0x48 = uVar3 & 0xfe7f | uVar14 | uVar12;
  *(ushort *)&pnVar10->field_0x48 =
       uVar3 & 0xfe5f | uVar14 | uVar12 | *(ushort *)&pnVar19->field_0x48 & 0x20;
  pnVar10->shadow = pnVar19;
  pnVar20 = local_40;
LAB_0015ce34:
  r = local_60;
  in = local_68;
  ppnVar13 = local_88;
  *local_88 = pnVar6;
  for (; pnVar6 != (ngx_chain_t *)0x0; pnVar6 = pnVar6->next) {
    ppnVar13 = &pnVar6->next;
  }
LAB_0015c6f9:
  in = in->next;
  goto LAB_0015c607;
}

Assistant:

static ngx_int_t
ngx_http_charset_body_filter(ngx_http_request_t *r, ngx_chain_t *in)
{
    ngx_int_t                rc;
    ngx_buf_t               *b;
    ngx_chain_t             *cl, *out, **ll;
    ngx_http_charset_ctx_t  *ctx;

    ctx = ngx_http_get_module_ctx(r, ngx_http_charset_filter_module);

    if (ctx == NULL || ctx->table == NULL) {
        return ngx_http_next_body_filter(r, in);
    }

    if ((ctx->to_utf8 || ctx->from_utf8) || ctx->busy) {

        out = NULL;
        ll = &out;

        for (cl = in; cl; cl = cl->next) {
            b = cl->buf;

            if (ngx_buf_size(b) == 0) {

                *ll = ngx_alloc_chain_link(r->pool);
                if (*ll == NULL) {
                    return NGX_ERROR;
                }

                (*ll)->buf = b;
                (*ll)->next = NULL;

                ll = &(*ll)->next;

                continue;
            }

            if (ctx->to_utf8) {
                *ll = ngx_http_charset_recode_to_utf8(r->pool, b, ctx);

            } else {
                *ll = ngx_http_charset_recode_from_utf8(r->pool, b, ctx);
            }

            if (*ll == NULL) {
                return NGX_ERROR;
            }

            while (*ll) {
                ll = &(*ll)->next;
            }
        }

        rc = ngx_http_next_body_filter(r, out);

        if (out) {
            if (ctx->busy == NULL) {
                ctx->busy = out;

            } else {
                for (cl = ctx->busy; cl->next; cl = cl->next) { /* void */ }
                cl->next = out;
            }
        }

        while (ctx->busy) {

            cl = ctx->busy;
            b = cl->buf;

            if (ngx_buf_size(b) != 0) {
                break;
            }

            ctx->busy = cl->next;

            if (b->tag != (ngx_buf_tag_t) &ngx_http_charset_filter_module) {
                continue;
            }

            if (b->shadow) {
                b->shadow->pos = b->shadow->last;
            }

            if (b->pos) {
                cl->next = ctx->free_buffers;
                ctx->free_buffers = cl;
                continue;
            }

            cl->next = ctx->free_bufs;
            ctx->free_bufs = cl;
        }

        return rc;
    }

    for (cl = in; cl; cl = cl->next) {
        (void) ngx_http_charset_recode(cl->buf, ctx->table);
    }

    return ngx_http_next_body_filter(r, in);
}